

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

transformation_t *
opengv::relative_pose::optimize_nonlinear
          (transformation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  PointerType ptr;
  void *pvVar4;
  long lVar5;
  undefined8 *puVar6;
  double *pdVar7;
  VectorXd x;
  FVectorType local_238;
  cayley_t local_228 [3];
  cayley_t local_1d8;
  NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>
  local_1b8;
  undefined1 local_198 [96];
  undefined1 auStack_138 [40];
  Index local_110;
  undefined1 uStack_108;
  undefined7 uStack_107;
  undefined1 uStack_100;
  undefined7 uStack_ff;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>
  *local_e0;
  undefined1 local_c8 [64];
  
  local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pvVar4 = malloc(0x70);
  if (pvVar4 == (void *)0x0) {
    pdVar7 = (double *)0x0;
  }
  else {
    *(void **)(((ulong)pvVar4 & 0xffffffffffffffc0) + 0x38) = pvVar4;
    pdVar7 = (double *)(((ulong)pvVar4 & 0xffffffffffffffc0) + 0x40);
  }
  if (pdVar7 != (double *)0x0) {
    local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 6;
    dVar2 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    dVar1 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[2];
    *pdVar7 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array[0];
    pdVar7[1] = dVar2;
    pdVar7[2] = dVar1;
    local_198._64_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[8];
    local_198._0_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[0];
    local_198._8_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[1];
    local_198._16_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[2];
    local_198._24_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[3];
    local_198._32_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[4];
    local_198._40_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[5];
    local_198._48_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[6];
    local_198._56_8_ =
         (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
         m_data.array[7];
    local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar7;
    math::rot2cayley(local_228,(rotation_t *)local_198);
    local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[3] =
         local_228[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[4] =
         local_228[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[5] =
         local_228[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    local_1b8.super_OptimizeNonlinearFunctor1.super_OptimizationFunctor<double,__1,__1>.m_values =
         (int)indices->_numberCorrespondences;
    local_e0 = &local_1b8;
    local_1b8.super_OptimizeNonlinearFunctor1.super_OptimizationFunctor<double,__1,__1>.m_inputs = 6
    ;
    local_1b8.epsfcn = 0.0;
    local_198._0_8_ = 100.0;
    local_c8 = ZEXT864(0) << 0x20;
    local_198._48_8_ = (double *)0x0;
    local_198._56_8_ = 0.0;
    local_198._64_8_ = (double *)0x0;
    local_198._72_24_ = local_c8._0_24_;
    auStack_138 = (undefined1  [40])0x0;
    local_110 = 0;
    uStack_108 = 0;
    uStack_107 = 0;
    uStack_100 = 0;
    uStack_ff = 0;
    uStack_f8 = 0;
    uStack_f7 = 0;
    uStack_f0 = 0;
    uStack_ef = 0;
    local_198._32_8_ = 0.0;
    local_198._40_8_ = SUB128(ZEXT812(0),4);
    local_198._16_8_ = 2.220446049250313e-15;
    local_198._24_8_ = 2.220446049250313e-15;
    local_198._8_8_ = 4.94065645841247e-321;
    local_1b8.super_OptimizeNonlinearFunctor1._adapter = adapter;
    local_1b8.super_OptimizeNonlinearFunctor1._indices = indices;
    Eigen::
    LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
    ::minimize((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
                *)local_198,&local_238);
    dVar1 = local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[1];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
    .m_data.array[9] =
         *local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
    .m_data.array[10] = dVar1;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
    .m_data.array[0xb] =
         local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         [2];
    local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [3];
    local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [4];
    local_1d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [5];
    math::cayley2rot(&local_1d8);
    lVar5 = 0x10;
    do {
      uVar3 = *(undefined8 *)
               ((long)local_228[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + lVar5 + -8);
      puVar6 = (undefined8 *)
               ((long)(__return_storage_ptr__->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data
                      .array + lVar5 + -0x10);
      *puVar6 = *(undefined8 *)
                 ((long)&local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data + lVar5);
      puVar6[1] = uVar3;
      *(undefined8 *)
       ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>)
              .m_storage.m_data.array + lVar5) =
           *(undefined8 *)
            ((long)local_228[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array + lVar5);
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x58);
    Eigen::
    LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
    ::~LevenbergMarquardt
              ((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::OptimizeNonlinearFunctor1,_(Eigen::NumericalDiffMode)0>,_double>
                *)local_198);
    if (local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_238.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[-1]);
    }
    return __return_storage_ptr__;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = operator_delete;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

transformation_t optimize_nonlinear(
    RelativeAdapterBase & adapter,
    const Indices & indices )
{
  const int n=6;
  VectorXd x(n);

  x.block<3,1>(0,0) = adapter.gett12();
  x.block<3,1>(3,0) = math::rot2cayley(adapter.getR12());

  OptimizeNonlinearFunctor1 functor( adapter, indices );
  NumericalDiff<OptimizeNonlinearFunctor1> numDiff(functor);
  LevenbergMarquardt< NumericalDiff<OptimizeNonlinearFunctor1> >
      lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 1.E1*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E1*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 1000;
  lm.minimize(x);

  transformation_t transformation;
  transformation.col(3) = x.block<3,1>(0,0);
  transformation.block<3,3>(0,0) = math::cayley2rot(x.block<3,1>(3,0));
  return transformation;
}